

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

int yin_print_model_(lyout *out,int level,lys_module *module)

{
  lys_ext *plVar1;
  lys_feature *plVar2;
  lys_deviation *plVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  uint ext_size;
  int iVar7;
  int extraout_EAX;
  lys_import *plVar8;
  lys_include *plVar9;
  lys_module *plVar10;
  lys_module *plVar11;
  lys_deviate *plVar12;
  lys_ext_instance **pplVar13;
  long lVar14;
  lyout *plVar15;
  int endflag;
  char *pcVar16;
  lys_iffeature *attr_value;
  lys_deviate *plVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  lys_node *plVar23;
  undefined8 local_60;
  int close;
  int local_4c;
  lyout *plStack_48;
  int content;
  ulong local_40;
  lys_module *local_38;
  
  bVar5 = module->field_0x40;
  if ((bVar5 & 0x30) == 0x10) {
    ly_print(out,"<!-- DEVIATED -->\n");
    bVar5 = module->field_0x40;
  }
  uVar4 = level * 2;
  uVar22 = level + 1;
  _close = (ulong)uVar22;
  plStack_48 = out;
  if ((bVar5 & 1) == 0) {
    ly_print(out,"%*s<module name=\"%s\"\n",(ulong)uVar4,"",module->name);
    yin_print_xmlns(out,module);
    ly_print(out,">\n");
    bVar5 = (byte)module->field_0x40 >> 1 & 7;
    if (bVar5 != 0) {
      pcVar16 = "1";
      if (bVar5 == 2) {
        pcVar16 = "1.1";
      }
      yin_print_substmt(out,uVar22,LYEXT_SUBSTMT_VERSION,'\0',pcVar16,module,module->ext,
                        (uint)module->ext_size);
    }
    yin_print_substmt(out,uVar22,LYEXT_SUBSTMT_NAMESPACE,'\0',module->ns,module,module->ext,
                      (uint)module->ext_size);
    yin_print_substmt(out,uVar22,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,module->ext,
                      (uint)module->ext_size);
  }
  else {
    ly_print(out,"%*s<submodule name=\"%s\"\n",(ulong)uVar4,"",module->name);
    yin_print_xmlns(out,module);
    ly_print(out,">\n");
    plVar10 = lys_main_module(module);
    if (((plVar10->field_0x40 & 0xc) != 0) ||
       (iVar18 = lys_ext_iter(module->ext,module->ext_size,'\0',LYEXT_SUBSTMT_VERSION), iVar18 != -1
       )) {
      pcVar16 = "1";
      if (((ulong)module->data->parent & 0xe) == 4) {
        pcVar16 = "1.1";
      }
      yin_print_substmt(out,uVar22,LYEXT_SUBSTMT_VERSION,'\0',pcVar16,module,module->ext,
                        (uint)module->ext_size);
    }
    yin_print_open(out,uVar22,(char *)0x0,"belongs-to","module",module->data->dsc,1);
    iVar18 = lys_ext_iter(module->ext,module->ext_size,'\0',LYEXT_SUBSTMT_BELONGSTO);
    for (; iVar18 != -1;
        iVar18 = lys_ext_iter(module->ext,module->ext_size,(char)iVar18 + '\x01',
                              LYEXT_SUBSTMT_BELONGSTO)) {
      yin_print_extension_instances
                (out,level + 2,module,LYEXT_SUBSTMT_BELONGSTO,'\0',module->ext + iVar18,1);
    }
    yin_print_substmt(out,level + 2,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,module->ext,
                      (uint)module->ext_size);
    ly_print(out,"%*s</%s>\n",(ulong)(uint)((int)_close * 2),"","belongs-to");
  }
  plVar15 = plStack_48;
  if (module->imp_size != '\0') {
    local_40 = CONCAT44(local_40._4_4_,level + 2);
    iVar18 = (int)_close;
    lVar14 = 0;
    uVar20 = 0;
    do {
      yin_print_open(plVar15,(int)_close,(char *)0x0,"import","module",
                     *(char **)(*(long *)(module->imp->rev + lVar14 + -0x10) + 8),1);
      iVar6 = (int)local_40;
      yin_print_extension_instances
                (plVar15,(int)local_40,module,LYEXT_SUBSTMT_SELF,'\0',
                 *(lys_ext_instance ***)(module->imp->rev + lVar14 + 0x10),
                 (uint)(byte)module->imp->rev[lVar14 + 0xb]);
      plVar8 = module->imp;
      yin_print_substmt(plVar15,iVar6,LYEXT_SUBSTMT_PREFIX,'\0',
                        *(char **)(plVar8->rev + lVar14 + -8),module,
                        *(lys_ext_instance ***)(plVar8->rev + lVar14 + 0x10),
                        (uint)(byte)plVar8->rev[lVar14 + 0xb]);
      plVar8 = module->imp;
      if (plVar8->rev[lVar14] != '\0') {
        yin_print_substmt(plVar15,(int)local_40,LYEXT_SUBSTMT_REVISIONDATE,'\0',plVar8->rev + lVar14
                          ,module,*(lys_ext_instance ***)(plVar8->rev + lVar14 + 0x10),
                          (uint)(byte)plVar8->rev[lVar14 + 0xb]);
        plVar8 = module->imp;
      }
      iVar6 = (int)local_40;
      yin_print_substmt(plVar15,(int)local_40,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                        *(char **)(plVar8->rev + lVar14 + 0x18),module,
                        *(lys_ext_instance ***)(plVar8->rev + lVar14 + 0x10),
                        (uint)(byte)plVar8->rev[lVar14 + 0xb]);
      plVar8 = module->imp;
      yin_print_substmt(plVar15,iVar6,LYEXT_SUBSTMT_REFERENCE,'\0',
                        *(char **)(plVar8->rev + lVar14 + 0x20),module,
                        *(lys_ext_instance ***)(plVar8->rev + lVar14 + 0x10),
                        (uint)(byte)plVar8->rev[lVar14 + 0xb]);
      ly_print(plVar15,"%*s</%s>\n",iVar18 * 2,"","import");
      uVar20 = uVar20 + 1;
      lVar14 = lVar14 + 0x38;
    } while (uVar20 < module->imp_size);
  }
  plVar15 = plStack_48;
  if (module->inc_size != '\0') {
    iVar18 = level + 2;
    local_40 = CONCAT44(local_40._4_4_,(int)_close * 2);
    lVar14 = 0x18;
    uVar20 = 0;
    do {
      plVar9 = module->inc;
      if ((((plVar9->rev[lVar14 + -0x18] == '\0') && (*(long *)(plVar9->rev + lVar14) == 0)) &&
          (*(long *)(plVar9->rev + lVar14 + 8) == 0)) && (plVar9->rev[lVar14 + -0xd] == '\0')) {
        yin_print_open(plStack_48,(int)_close,(char *)0x0,"include","module",
                       *(char **)(*(long *)(plVar9->rev + lVar14 + -0x20) + 8),-1);
      }
      else {
        yin_print_open(plVar15,(int)_close,(char *)0x0,"include","module",
                       *(char **)(*(long *)(plVar9->rev + lVar14 + -0x20) + 8),1);
        yin_print_extension_instances
                  (plVar15,iVar18,module,LYEXT_SUBSTMT_SELF,'\0',
                   *(lys_ext_instance ***)(module->inc->rev + lVar14 + -8),
                   (uint)(byte)module->inc->rev[lVar14 + -0xd]);
        plVar9 = module->inc;
        if (plVar9->rev[lVar14 + -0x18] != '\0') {
          pcVar16 = plVar9->rev + lVar14 + -8;
          yin_print_substmt(plVar15,iVar18,LYEXT_SUBSTMT_REVISIONDATE,'\0',pcVar16 + -0x10,module,
                            *(lys_ext_instance ***)pcVar16,(uint)(byte)pcVar16[-5]);
          plVar9 = module->inc;
        }
        yin_print_substmt(plVar15,iVar18,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                          *(char **)(plVar9->rev + lVar14),module,
                          *(lys_ext_instance ***)(plVar9->rev + lVar14 + -8),
                          (uint)(byte)plVar9->rev[lVar14 + -0xd]);
        plVar9 = module->inc;
        yin_print_substmt(plVar15,iVar18,LYEXT_SUBSTMT_REFERENCE,'\0',
                          *(char **)(plVar9->rev + lVar14 + 8),module,
                          *(lys_ext_instance ***)(plVar9->rev + lVar14 + -8),
                          (uint)(byte)plVar9->rev[lVar14 + -0xd]);
        ly_print(plVar15,"%*s</%s>\n",local_40 & 0xffffffff,"","include");
      }
      uVar20 = uVar20 + 1;
      lVar14 = lVar14 + 0x30;
    } while (uVar20 < module->inc_size);
  }
  plVar15 = plStack_48;
  uVar20 = _close;
  iVar18 = (int)_close;
  yin_print_substmt(plStack_48,iVar18,LYEXT_SUBSTMT_ORGANIZATION,'\0',module->org,module,module->ext
                    ,(uint)module->ext_size);
  yin_print_substmt(plVar15,iVar18,LYEXT_SUBSTMT_CONTACT,'\0',module->contact,module,module->ext,
                    (uint)module->ext_size);
  yin_print_substmt(plVar15,iVar18,LYEXT_SUBSTMT_DESCRIPTION,'\0',module->dsc,module,module->ext,
                    (uint)module->ext_size);
  yin_print_substmt(plVar15,iVar18,LYEXT_SUBSTMT_REFERENCE,'\0',module->ref,module,module->ext,
                    (uint)module->ext_size);
  if (module->rev_size != '\0') {
    lVar14 = 0;
    uVar21 = 0;
    do {
      yin_print_revision(plVar15,iVar18,module,(lys_revision *)(module->rev->date + lVar14));
      uVar21 = uVar21 + 1;
      lVar14 = lVar14 + 0x28;
    } while (uVar21 < module->rev_size);
  }
  local_38 = module;
  if (module->extensions_size != '\0') {
    iVar18 = level + 2;
    local_40 = CONCAT44(local_40._4_4_,level + 3);
    uVar21 = 0;
    do {
      plVar1 = local_38->extensions;
      plVar23 = (lys_node *)(plVar1 + uVar21);
      local_60._0_4_ = 0;
      yin_print_open(plVar15,(int)uVar20,(char *)0x0,"extension","name",plVar1[uVar21].name,0);
      yin_print_snode_common(plVar15,iVar18,plVar23,plVar1[uVar21].module,(int *)&local_60,1);
      attr_value = (lys_iffeature *)plVar1[uVar21].argument;
      if (attr_value != (lys_iffeature *)0x0) {
        if ((int)local_60 == 0) {
          local_60._0_4_ = 1;
          ly_print(plVar15,">\n");
          attr_value = plVar23->iffeature;
        }
        iVar7 = 0;
        yin_print_open(plVar15,iVar18,(char *)0x0,"argument","name",(char *)attr_value,0);
        iVar6 = lys_ext_iter(plVar23->ext,plVar23->ext_size,'\0',LYEXT_SUBSTMT_ARGUMENT);
        if (iVar6 != -1) {
          iVar7 = 0;
          do {
            if (iVar7 == 0) {
              ly_print(plStack_48,">\n");
              iVar7 = 1;
            }
            yin_print_extension_instances
                      (plStack_48,(int)local_40,plVar23->module,LYEXT_SUBSTMT_ARGUMENT,'\0',
                       plVar23->ext + iVar6,1);
            iVar6 = lys_ext_iter(plVar23->ext,plVar23->ext_size,(char)iVar6 + '\x01',
                                 LYEXT_SUBSTMT_ARGUMENT);
          } while (iVar6 != -1);
        }
        if (((plVar23->flags & 1) != 0) ||
           (iVar6 = lys_ext_iter(plVar23->ext,plVar23->ext_size,'\0',LYEXT_SUBSTMT_YINELEM),
           plVar15 = plStack_48, iVar6 != -1)) {
          if (iVar7 == 0) {
            ly_print(plStack_48,">\n");
            iVar7 = 1;
          }
          plVar15 = plStack_48;
          pcVar16 = "true";
          if ((plVar23->flags & 1) == 0) {
            pcVar16 = "false";
          }
          yin_print_substmt(plStack_48,(int)local_40,LYEXT_SUBSTMT_YINELEM,'\0',pcVar16,
                            plVar23->module,plVar23->ext,(uint)plVar23->ext_size);
        }
        yin_print_close(plVar15,iVar18,(char *)0x0,"argument",iVar7);
      }
      yin_print_snode_common(plVar15,iVar18,plVar23,plVar23->module,(int *)&local_60,0x70);
      uVar20 = _close;
      yin_print_close(plVar15,(int)_close,(char *)0x0,"extension",(int)local_60);
      uVar21 = uVar21 + 1;
    } while (uVar21 < local_38->extensions_size);
  }
  plVar10 = local_38;
  iVar18 = (int)uVar20;
  if (local_38->ext_size != 0) {
    yin_print_extension_instances
              (plVar15,iVar18,local_38,LYEXT_SUBSTMT_SELF,'\0',local_38->ext,
               (uint)local_38->ext_size);
  }
  if (plVar10->features_size != '\0') {
    local_40 = CONCAT44(local_40._4_4_,level + 2);
    lVar14 = 0;
    uVar21 = 0;
    do {
      plVar2 = local_38->features;
      local_60._0_4_ = 0;
      yin_print_open(plStack_48,iVar18,(char *)0x0,"feature","name",
                     *(char **)(plVar2->padding + lVar14 + -0x1c),0);
      plVar10 = local_38;
      plVar15 = plStack_48;
      yin_print_snode_common
                (plStack_48,(int)local_40,(lys_node *)(plVar2->padding + lVar14 + -0x1c),
                 *(lys_module **)(plVar2->padding + lVar14 + 0x14),(int *)&local_60,0x73);
      yin_print_close(plVar15,iVar18,(char *)0x0,"feature",(int)local_60);
      uVar21 = uVar21 + 1;
      lVar14 = lVar14 + 0x40;
    } while (uVar21 < plVar10->features_size);
  }
  if (plVar10->ident_size != 0) {
    iVar6 = level + 2;
    uVar21 = 0;
    do {
      plVar23 = (lys_node *)(plVar10->ident + uVar21);
      local_4c = 0;
      local_40 = uVar21;
      yin_print_open(plVar15,(int)uVar20,(char *)0x0,"identity","name",plVar23->name,0);
      yin_print_snode_common(plVar15,iVar6,plVar23,plVar23->module,&local_4c,3);
      if (plVar23->padding[3] != '\0') {
        uVar20 = 0;
        do {
          if (local_4c == 0) {
            local_4c = 1;
            ly_print(plStack_48,">\n");
          }
          plVar10 = lys_main_module(*(lys_module **)
                                     (*(long *)(*(long *)&plVar23->nodetype + uVar20 * 8) + 0x30));
          plVar11 = lys_main_module(plVar23->module);
          if (plVar11 == plVar10) {
            yin_print_substmt(plStack_48,iVar6,LYEXT_SUBSTMT_BASE,(uint8_t)uVar20,
                              (char *)**(undefined8 **)(*(long *)&plVar23->nodetype + uVar20 * 8),
                              plVar23->module,plVar23->ext,(uint)plVar23->ext_size);
          }
          else {
            pcVar16 = transform_module_name2import_prefix(plVar23->module,plVar10->name);
            asprintf((char **)&local_60,"%s:%s",pcVar16,
                     **(undefined8 **)(*(long *)&plVar23->nodetype + uVar20 * 8));
            yin_print_substmt(plStack_48,iVar6,LYEXT_SUBSTMT_BASE,(uint8_t)uVar20,
                              (char *)CONCAT44(local_60._4_4_,(int)local_60),plVar23->module,
                              plVar23->ext,(uint)plVar23->ext_size);
            free((void *)CONCAT44(local_60._4_4_,(int)local_60));
          }
          uVar20 = uVar20 + 1;
          plVar10 = local_38;
        } while (uVar20 < plVar23->padding[3]);
      }
      plVar15 = plStack_48;
      yin_print_snode_common(plStack_48,iVar6,plVar23,plVar23->module,&local_4c,0x70);
      uVar20 = _close;
      iVar18 = (int)_close;
      yin_print_close(plVar15,iVar18,(char *)0x0,"identity",local_4c);
      uVar21 = local_40 + 1;
    } while (uVar21 < plVar10->ident_size);
  }
  if (plVar10->tpdf_size != '\0') {
    lVar14 = 0;
    uVar20 = 0;
    do {
      yin_print_typedef(plVar15,iVar18,plVar10,(lys_tpdf *)(plVar10->tpdf->padding + lVar14 + -0x1c)
                       );
      uVar20 = uVar20 + 1;
      lVar14 = lVar14 + 0x80;
    } while (uVar20 < plVar10->tpdf_size);
  }
  plVar10 = lys_main_module(plVar10);
  for (plVar23 = plVar10->data; plVar23 != (lys_node *)0x0; plVar23 = plVar23->next) {
    if (plVar23->module == local_38) {
      yin_print_snode(plVar15,iVar18,plVar23,0x800);
    }
  }
  plVar10 = lys_main_module(local_38);
  for (plVar23 = plVar10->data; plVar10 = local_38, plVar23 != (lys_node *)0x0;
      plVar23 = plVar23->next) {
    if (plVar23->module == local_38) {
      yin_print_snode(plVar15,iVar18,plVar23,0x903f);
    }
  }
  if (local_38->augment_size != '\0') {
    lVar14 = 0;
    uVar20 = 0;
    do {
      yin_print_augment(plVar15,iVar18,plVar10,
                        (lys_node_augment *)(plVar10->augment->padding + lVar14 + -0x1c));
      uVar20 = uVar20 + 1;
      lVar14 = lVar14 + 0x68;
    } while (uVar20 < plVar10->augment_size);
  }
  plVar10 = lys_main_module(plVar10);
  for (plVar23 = plVar10->data; plVar23 != (lys_node *)0x0; plVar23 = plVar23->next) {
    if (plVar23->module == local_38) {
      yin_print_snode(plVar15,iVar18,plVar23,0x4100);
    }
  }
  plVar10 = lys_main_module(local_38);
  for (plVar23 = plVar10->data; plVar23 != (lys_node *)0x0; plVar23 = plVar23->next) {
    if (plVar23->module == local_38) {
      yin_print_snode(plVar15,iVar18,plVar23,0x80);
    }
  }
  if (local_38->deviation_size != '\0') {
    iVar6 = level + 2;
    uVar22 = level * 2 + 4;
    local_40 = CONCAT44(local_40._4_4_,level + 3);
    iVar18 = (int)_close;
    uVar20 = 0;
    do {
      plVar3 = local_38->deviation;
      pcVar16 = transform_json2schema(local_38,plVar3[uVar20].target_name);
      yin_print_open(plVar15,(int)_close,(char *)0x0,"deviation","target-node",pcVar16,1);
      plVar10 = local_38;
      lydict_remove(local_38->ctx,pcVar16);
      ext_size = 0;
      if (plVar3[uVar20].ext_size != 0) {
        yin_print_extension_instances
                  (plVar15,iVar6,plVar10,LYEXT_SUBSTMT_SELF,'\0',plVar3[uVar20].ext,
                   (uint)plVar3[uVar20].ext_size);
        ext_size = (uint)plVar3[uVar20].ext_size;
      }
      yin_print_substmt(plVar15,iVar6,LYEXT_SUBSTMT_DESCRIPTION,'\0',plVar3[uVar20].dsc,plVar10,
                        plVar3[uVar20].ext,ext_size);
      yin_print_substmt(plVar15,iVar6,LYEXT_SUBSTMT_REFERENCE,'\0',plVar3[uVar20].ref,plVar10,
                        plVar3[uVar20].ext,(uint)plVar3[uVar20].ext_size);
      if (plVar3[uVar20].deviate_size != '\0') {
        uVar21 = 0;
        do {
          ly_print(plVar15,"%*s<deviate value=",(ulong)uVar22,"");
          pcVar16 = "\"add\">\n";
          switch(plVar3[uVar20].deviate[uVar21].mod) {
          case LY_DEVIATE_NO:
            pcVar16 = "\"not-supported\">\n";
            if (plVar3[uVar20].deviate[uVar21].ext_size != '\0') break;
            ly_print(plVar15,"\"not-supported\"/>\n");
            goto LAB_00179503;
          case LY_DEVIATE_ADD:
            break;
          case LY_DEVIATE_RPL:
            pcVar16 = "\"replace\">\n";
            break;
          case LY_DEVIATE_DEL:
            pcVar16 = "\"delete\">\n";
            break;
          default:
            goto switchD_001790e1_default;
          }
          ly_print(plVar15,pcVar16);
switchD_001790e1_default:
          plVar12 = plVar3[uVar20].deviate;
          if (plVar12[uVar21].ext_size != 0) {
            yin_print_extension_instances
                      (plVar15,(int)local_40,local_38,LYEXT_SUBSTMT_SELF,'\0',plVar12[uVar21].ext,
                       (uint)plVar12[uVar21].ext_size);
            plVar12 = plVar3[uVar20].deviate;
          }
          plVar10 = local_38;
          iVar7 = (int)local_40;
          if (plVar12[uVar21].type != (lys_type *)0x0) {
            yin_print_type(plVar15,(int)local_40,local_38,plVar12[uVar21].type);
            plVar12 = plVar3[uVar20].deviate;
          }
          yin_print_substmt(plVar15,iVar7,LYEXT_SUBSTMT_UNITS,'\0',plVar12[uVar21].units,plVar10,
                            plVar12[uVar21].ext,(uint)plVar12[uVar21].ext_size);
          plVar12 = plVar3[uVar20].deviate;
          if (plVar12[uVar21].must_size != '\0') {
            lVar14 = 0;
            uVar19 = 0;
            do {
              yin_print_must(plStack_48,(int)local_40,local_38,
                             (lys_restr *)((long)&(plVar12[uVar21].must)->expr + lVar14));
              uVar19 = uVar19 + 1;
              plVar12 = plVar3[uVar20].deviate;
              lVar14 = lVar14 + 0x38;
            } while (uVar19 < plVar12[uVar21].must_size);
          }
          plVar15 = plStack_48;
          if (plVar12[uVar21].unique_size != '\0') {
            uVar19 = 0;
            iVar7 = (int)local_40;
            do {
              yin_print_unique(plVar15,iVar7,plVar12[uVar21].unique + uVar19);
              plVar12 = plVar3[uVar20].deviate;
              iVar7 = -1;
              while (iVar7 = lys_ext_iter(plVar12[uVar21].ext,plVar12[uVar21].ext_size,
                                          (char)iVar7 + '\x01',LYEXT_SUBSTMT_UNIQUE), iVar7 != -1) {
                plVar12 = plVar3[uVar20].deviate;
                if (uVar19 == plVar12[uVar21].ext[iVar7]->insubstmt_index) {
                  ly_print(plVar15,">\n");
                  pplVar13 = plVar3[uVar20].deviate[uVar21].ext;
                  do {
                    yin_print_extension_instances
                              (plVar15,level + 4,local_38,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar19,
                               pplVar13 + iVar7,1);
                    plVar12 = plVar3[uVar20].deviate;
                    do {
                      iVar7 = lys_ext_iter(plVar12[uVar21].ext,plVar12[uVar21].ext_size,
                                           (char)iVar7 + '\x01',LYEXT_SUBSTMT_UNIQUE);
                      if (iVar7 == -1) {
                        endflag = 1;
                        goto LAB_00179314;
                      }
                      plVar12 = plVar3[uVar20].deviate;
                      pplVar13 = plVar12[uVar21].ext;
                    } while (uVar19 != pplVar13[iVar7]->insubstmt_index);
                  } while( true );
                }
              }
              endflag = 0;
LAB_00179314:
              iVar7 = (int)local_40;
              yin_print_close(plVar15,(int)local_40,(char *)0x0,"unique",endflag);
              uVar19 = uVar19 + 1;
              plVar12 = plVar3[uVar20].deviate;
            } while (uVar19 < plVar12[uVar21].unique_size);
          }
          plVar10 = local_38;
          plVar17 = plVar12 + uVar21;
          if (plVar17->dflt_size != '\0') {
            uVar19 = 0;
            do {
              yin_print_substmt(plVar15,(int)local_40,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar19,
                                plVar17->dflt[uVar19],plVar10,plVar17->ext,(uint)plVar17->ext_size);
              uVar19 = uVar19 + 1;
              plVar12 = plVar3[uVar20].deviate;
              plVar17 = plVar12 + uVar21;
            } while (uVar19 < plVar17->dflt_size);
          }
          pcVar16 = "true";
          if (((plVar17->flags & 1) != 0) || (pcVar16 = "false", (plVar17->flags & 2) != 0)) {
            yin_print_substmt(plVar15,(int)local_40,LYEXT_SUBSTMT_CONFIG,'\0',pcVar16,plVar10,
                              plVar12->ext,(uint)plVar17->ext_size);
            plVar10 = local_38;
          }
          plVar12 = plVar3[uVar20].deviate;
          pcVar16 = "true";
          if (((plVar12[uVar21].flags & 0x40) != 0) ||
             (pcVar16 = "false", (char)plVar12[uVar21].flags < '\0')) {
            yin_print_substmt(plVar15,(int)local_40,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar16,plVar10,
                              plVar12[uVar21].ext,(uint)plVar12[uVar21].ext_size);
            plVar10 = local_38;
          }
          plVar12 = plVar3[uVar20].deviate;
          if (plVar12[uVar21].min_set != '\0') {
            yin_print_unsigned(plVar15,(int)local_40,LYEXT_SUBSTMT_MIN,'\0',plVar10,
                               plVar12[uVar21].ext,(uint)plVar12[uVar21].ext_size,
                               plVar12[uVar21].min);
            plVar12 = plVar3[uVar20].deviate;
          }
          if (plVar12[uVar21].max_set != '\0') {
            if (plVar12[uVar21].max == 0) {
              yin_print_substmt(plVar15,(int)local_40,LYEXT_SUBSTMT_MAX,'\0',"unbounded",local_38,
                                plVar12[uVar21].ext,(uint)plVar12[uVar21].ext_size);
            }
            else {
              yin_print_unsigned(plVar15,(int)local_40,LYEXT_SUBSTMT_MAX,'\0',local_38,
                                 plVar12[uVar21].ext,(uint)plVar12[uVar21].ext_size,
                                 plVar12[uVar21].max);
            }
          }
          ly_print(plVar15,"%*s</%s>\n",(ulong)uVar22,"");
LAB_00179503:
          uVar21 = uVar21 + 1;
        } while (uVar21 < plVar3[uVar20].deviate_size);
      }
      ly_print(plVar15,"%*s</%s>\n",(ulong)(uint)(iVar18 * 2),"","deviation");
      uVar20 = uVar20 + 1;
    } while (uVar20 < local_38->deviation_size);
  }
  pcVar16 = "%*s</submodule>\n";
  if ((local_38->field_0x40 & 1) == 0) {
    pcVar16 = "%*s</module>\n";
  }
  ly_print(plVar15,pcVar16,(ulong)uVar4,"");
  ly_print_flush(plVar15);
  return extraout_EAX;
}

Assistant:

static int
yin_print_model_(struct lyout *out, int level, const struct lys_module *module)
{
    unsigned int i;
    int p;
    struct lys_node *node;

    if (module->deviated == 1) {
        ly_print(out, "<!-- DEVIATED -->\n");
    }

    /* (sub)module-header-stmts */
    if (module->type) {
        ly_print(out, "%*s<submodule name=\"%s\"\n", LEVEL, INDENT, module->name);
        yin_print_xmlns(out, module);
        ly_print(out, ">\n");

        level++;
        if (lys_main_module(module)->version > 1 ||
                lys_ext_iter(module->ext, module->ext_size, 0, LYEXT_SUBSTMT_VERSION) != -1) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0,
                              ((struct lys_submodule *)module)->belongsto->version == 2 ? "1.1" : "1",
                              module, module->ext, module->ext_size);
        }
        yin_print_open(out, level, NULL, "belongs-to", "module", ((struct lys_submodule *)module)->belongsto->name, 1);
        p = -1;
        while ((p = lys_ext_iter(module->ext, module->ext_size, p + 1, LYEXT_SUBSTMT_BELONGSTO)) != -1) {
            yin_print_extension_instances(out, level + 1, module, LYEXT_SUBSTMT_BELONGSTO, 0, &module->ext[p], 1);
        }
        yin_print_substmt(out, level + 1, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                          module, module->ext, module->ext_size);
        yin_print_close(out, level, NULL, "belongs-to", 1);
    } else {
        ly_print(out, "%*s<module name=\"%s\"\n", LEVEL, INDENT, module->name);
        yin_print_xmlns(out, module);
        ly_print(out, ">\n");

        level++;
        if (module->version) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0, module->version == 2 ? "1.1" : "1",
                              module, module->ext, module->ext_size);
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_NAMESPACE, 0, module->ns,
                          module, module->ext, module->ext_size);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                           module, module->ext, module->ext_size);
    }

    /* linkage-stmts */
    for (i = 0; i < module->imp_size; i++) {
        yin_print_open(out, level, NULL, "import", "module", module->imp[i].module->name, 1);
        level++;

        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                       module->imp[i].ext, module->imp[i].ext_size);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->imp[i].prefix,
                          module, module->imp[i].ext, module->imp[i].ext_size);
        if (module->imp[i].rev[0]) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->imp[i].rev,
                              module, module->imp[i].ext, module->imp[i].ext_size);
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->imp[i].dsc,
                          module, module->imp[i].ext, module->imp[i].ext_size);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->imp[i].ref,
                          module, module->imp[i].ext, module->imp[i].ext_size);

        level--;
        yin_print_close(out, level, NULL, "import", 1);
    }
    for (i = 0; i < module->inc_size; i++) {
        if (module->inc[i].rev[0] || module->inc[i].dsc || module->inc[i].ref || module->inc[i].ext_size) {
            yin_print_open(out, level, NULL, "include", "module", module->inc[i].submodule->name, 1);
            level++;

            yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                          module->inc[i].ext, module->inc[i].ext_size);
            if (module->inc[i].rev[0]) {
                yin_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->inc[i].rev,
                                  module, module->inc[i].ext, module->inc[i].ext_size);
            }
            yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->inc[i].dsc,
                               module, module->inc[i].ext, module->inc[i].ext_size);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->inc[i].ref,
                              module, module->inc[i].ext, module->inc[i].ext_size);

            level--;
            yin_print_close(out, level, NULL, "include", 1);
        } else {
            yin_print_open(out, level, NULL, "include", "module", module->inc[i].submodule->name, -1);
        }
    }

    /* meta-stmts */
    yin_print_substmt(out, level, LYEXT_SUBSTMT_ORGANIZATION, 0, module->org,
                      module, module->ext, module->ext_size);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_CONTACT, 0, module->contact,
                      module, module->ext, module->ext_size);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->dsc,
                      module, module->ext, module->ext_size);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->ref,
                      module, module->ext, module->ext_size);

    /* revision-stmts */
    for (i = 0; i < module->rev_size; i++) {
        yin_print_revision(out, level, module, &module->rev[i]);
    }

    /* body-stmts */
    for (i = 0; i < module->extensions_size; ++i) {
        yin_print_extension(out, level, &module->extensions[i]);
    }
    if (module->ext_size) {
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, module->ext, module->ext_size);
    }

    for (i = 0; i < module->features_size; i++) {
        yin_print_feature(out, level, &module->features[i]);
    }

    for (i = 0; i < module->ident_size; i++) {
        yin_print_identity(out, level, &module->ident[i]);
    }

    for (i = 0; i < module->tpdf_size; i++) {
        yin_print_typedef(out, level, module, &module->tpdf[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_GROUPING);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                        LYS_USES | LYS_ANYDATA);
    }

    for (i = 0; i < module->augment_size; i++) {
        yin_print_augment(out, level, module, &module->augment[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_RPC | LYS_ACTION);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_NOTIF);
    }

    for (i = 0; i < module->deviation_size; ++i) {
        yin_print_deviation(out, level, module, &module->deviation[i]);
    }

    level--;
    if (module->type) {
        ly_print(out, "%*s</submodule>\n", LEVEL, INDENT);
    } else {
        ly_print(out, "%*s</module>\n", LEVEL, INDENT);
    }
    ly_print_flush(out);

    return EXIT_SUCCESS;
}